

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportSet.h
# Opt level: O3

void __thiscall cmExportSet::cmExportSet(cmExportSet *this,string *name)

{
  pointer pcVar1;
  
  (this->TargetExports).super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TargetExports).super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TargetExports).super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Name,pcVar1,pcVar1 + name->_M_string_length);
  (this->Installations).
  super__Vector_base<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Installations).
  super__Vector_base<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Installations).
  super__Vector_base<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

cmExportSet(const std::string &name) : Name(name) {}